

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O0

void DrawPolyLines(Vector2 center,int sides,float radius,float rotation,Color color)

{
  float fVar1;
  float fVar2;
  undefined4 local_28;
  undefined4 local_24;
  int i;
  float centralAngle;
  float rotation_local;
  float radius_local;
  int sides_local;
  Color color_local;
  Vector2 center_local;
  
  rotation_local = (float)sides;
  if (sides < 3) {
    rotation_local = 4.2039e-45;
  }
  local_24 = 0.0;
  rlCheckRenderBatchLimit((int)(0x168 / (long)(int)rotation_local) * 3);
  rlPushMatrix();
  sides_local = (int)center.x;
  color_local = (Color)center.y;
  rlTranslatef((float)sides_local,(float)color_local,0.0);
  rlRotatef(rotation,0.0,0.0,1.0);
  rlBegin(1);
  for (local_28 = 0; local_28 < (int)rotation_local; local_28 = local_28 + 1) {
    radius_local._0_1_ = color.r;
    radius_local._1_1_ = color.g;
    radius_local._2_1_ = color.b;
    radius_local._3_1_ = color.a;
    rlColor4ub(radius_local._0_1_,radius_local._1_1_,radius_local._2_1_,radius_local._3_1_);
    fVar1 = sinf(local_24 * 0.017453292);
    fVar2 = cosf(local_24 * 0.017453292);
    rlVertex2f(fVar1 * radius,fVar2 * radius);
    local_24 = 360.0 / (float)(int)rotation_local + local_24;
    fVar1 = sinf(local_24 * 0.017453292);
    fVar2 = cosf(local_24 * 0.017453292);
    rlVertex2f(fVar1 * radius,fVar2 * radius);
  }
  rlEnd();
  rlPopMatrix();
  return;
}

Assistant:

void DrawPolyLines(Vector2 center, int sides, float radius, float rotation, Color color)
{
    if (sides < 3) sides = 3;
    float centralAngle = 0.0f;

    rlCheckRenderBatchLimit(3*(360/sides));

    rlPushMatrix();
        rlTranslatef(center.x, center.y, 0.0f);
        rlRotatef(rotation, 0.0f, 0.0f, 1.0f);

        rlBegin(RL_LINES);
            for (int i = 0; i < sides; i++)
            {
                rlColor4ub(color.r, color.g, color.b, color.a);

                rlVertex2f(sinf(DEG2RAD*centralAngle)*radius, cosf(DEG2RAD*centralAngle)*radius);
                centralAngle += 360.0f/(float)sides;
                rlVertex2f(sinf(DEG2RAD*centralAngle)*radius, cosf(DEG2RAD*centralAngle)*radius);
            }
        rlEnd();
    rlPopMatrix();
}